

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O1

void __thiscall mathOps_multDivReciprocity_Test::TestBody(mathOps_multDivReciprocity_Test *this)

{
  unit_data *this_00;
  unit_data *other;
  unit_data *other_00;
  char *pcVar1;
  AssertionResult gtest_ar_3;
  measurement nm1b;
  measurement nm2b;
  measurement nm2b2;
  measurement nm4b;
  measurement nm3b;
  measurement nMass;
  measurement kgT;
  measurement kg1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_120;
  AssertHelper local_118;
  undefined1 local_110 [8];
  unit local_108;
  double local_100;
  double local_f8;
  undefined1 local_f0 [8];
  unit local_e8;
  measurement local_e0;
  measurement local_d0;
  measurement local_c0;
  measurement local_b0;
  measurement local_a0;
  measurement local_90;
  measurement local_80;
  measurement local_70;
  measurement local_60;
  measurement local_50;
  measurement local_40;
  
  this_00 = &local_40.units_.base_units_;
  local_40.value_ = 0.02;
  local_40.units_.multiplier_ = 0.001;
  local_40.units_.base_units_ = (unit_data)0x100;
  other = &local_50.units_.base_units_;
  local_50.value_ = 3.4;
  local_50.units_.multiplier_ = 907.18475;
  local_50.units_.base_units_ = (unit_data)0x100;
  other_00 = &local_60.units_.base_units_;
  local_60.value_ = 247.5;
  local_60.units_.multiplier_ = 0.45359236;
  local_60.units_.base_units_ = (unit_data)0x100;
  local_100._0_4_ = 1.1023113e-06;
  local_c0.units_.base_units_ = units::detail::unit_data::operator/(this_00,other);
  local_c0.value_ = 0.0058823529411764705;
  local_c0.units_.multiplier_ = local_100._0_4_;
  local_f8 = local_60.value_ * 0.0058823529411764705;
  local_100 = (double)CONCAT44(local_100._4_4_,local_100._0_4_ * local_60.units_.multiplier_);
  local_70.units_.base_units_ =
       units::detail::unit_data::operator*(&local_c0.units_.base_units_,other_00);
  local_70.value_ = local_f8;
  local_70.units_.multiplier_ = local_100._0_4_;
  local_100 = local_60.value_ / local_50.value_;
  local_f8._0_4_ = local_60.units_.multiplier_ / local_50.units_.multiplier_;
  local_80.units_.base_units_ = units::detail::unit_data::operator/(other_00,other);
  local_80.value_ = local_100;
  local_80.units_.multiplier_ = local_f8._0_4_;
  local_100 = local_100 * local_40.value_;
  local_f8._0_4_ = local_f8._0_4_ * local_40.units_.multiplier_;
  local_c0.units_.base_units_ =
       units::detail::unit_data::operator*(&local_80.units_.base_units_,this_00);
  local_c0.value_ = local_100;
  local_c0.units_.multiplier_ = local_f8._0_4_;
  local_100 = local_40.value_ * local_60.value_;
  local_f8._0_4_ = local_40.units_.multiplier_ * local_60.units_.multiplier_;
  local_90.units_.base_units_ = units::detail::unit_data::operator*(this_00,other_00);
  local_90.value_ = local_100;
  local_90.units_.multiplier_ = local_f8._0_4_;
  local_100 = local_100 / local_50.value_;
  local_f8._0_4_ = local_f8._0_4_ / local_50.units_.multiplier_;
  local_80.units_.base_units_ =
       units::detail::unit_data::operator/(&local_90.units_.base_units_,other);
  local_80.value_ = local_100;
  local_80.units_.multiplier_ = local_f8._0_4_;
  local_100 = local_40.value_ / local_50.value_;
  local_f8._0_4_ = local_40.units_.multiplier_ / local_50.units_.multiplier_;
  local_e8.base_units_ = units::detail::unit_data::operator/(this_00,other);
  local_e8.multiplier_ = local_f8._0_4_;
  local_f0 = (undefined1  [8])local_100;
  local_100 = local_100 * local_60.value_;
  local_f8 = (double)CONCAT44(local_f8._4_4_,local_f8._0_4_ * local_60.units_.multiplier_);
  local_90.units_.base_units_ =
       units::detail::unit_data::operator*(other_00,(unit_data *)(local_f0 + 0xc));
  local_90.value_ = local_100;
  local_90.units_.multiplier_ = local_f8._0_4_;
  testing::internal::CmpHelperEQ<units::measurement,units::measurement>
            ((internal *)local_f0,"nm1","nm2",&local_70,&local_c0);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_e8 == (unit)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x102,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if ((long *)local_e0.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_e0.value_ + 8))();
    }
  }
  if (local_e8 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
  }
  testing::internal::CmpHelperEQ<units::measurement,units::measurement>
            ((internal *)local_f0,"nm1","nm3",&local_70,&local_80);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_e8 == (unit)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x103,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if ((long *)local_e0.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_e0.value_ + 8))();
    }
  }
  if (local_e8 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
  }
  testing::internal::CmpHelperEQ<units::measurement,units::measurement>
            ((internal *)local_f0,"nm2","nm4",&local_c0,&local_90);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_e8 == (unit)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_e8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x104,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if ((long *)local_e0.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_e0.value_ + 8))();
    }
  }
  if (local_e8 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_f0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
  }
  local_e0 = units::divides<units::measurement,units::measurement,void>(&local_40,&local_50);
  _local_f0 = units::multiplies<units::measurement,units::measurement,void>(&local_e0,&local_60);
  local_d0 = units::divides<units::measurement,units::measurement,void>(&local_60,&local_50);
  local_e0 = units::multiplies<units::measurement,units::measurement,void>(&local_d0,&local_40);
  local_a0 = units::divides<units::measurement,units::measurement,void>(&local_60,&local_50);
  local_d0 = units::multiplies<units::measurement,units::measurement,void>(&local_40,&local_a0);
  local_b0 = units::multiplies<units::measurement,units::measurement,void>(&local_40,&local_60);
  local_a0 = units::divides<units::measurement,units::measurement,void>(&local_b0,&local_50);
  _local_110 = units::divides<units::measurement,units::measurement,void>(&local_40,&local_50);
  local_b0 = units::multiplies<units::measurement,units::measurement,void>
                       (&local_60,(measurement *)local_110);
  testing::internal::CmpHelperEQ<units::measurement,units::measurement>
            ((internal *)local_110,"nm1b","nm2b",(measurement *)local_f0,&local_e0);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_108 == (unit)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x10c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  if (local_108 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_110 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  }
  testing::internal::CmpHelperEQ<units::measurement,units::measurement>
            ((internal *)local_110,"nm2b","nm2b2",&local_e0,&local_d0);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_108 == (unit)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x10d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  if (local_108 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_110 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  }
  testing::internal::CmpHelperEQ<units::measurement,units::measurement>
            ((internal *)local_110,"nm1b","nm3b",(measurement *)local_f0,&local_a0);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_108 == (unit)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x10e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  if (local_108 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_110 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  }
  testing::internal::CmpHelperEQ<units::measurement,units::measurement>
            ((internal *)local_110,"nm2b","nm4b",&local_e0,&local_b0);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_108 == (unit)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x10f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  if (local_108 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_110 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  }
  testing::internal::CmpHelperEQ<units::measurement,units::measurement>
            ((internal *)local_110,"nm1","nm1b",&local_70,(measurement *)local_f0);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_108 == (unit)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x111,pcVar1);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  if (local_108 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_110 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  }
  testing::internal::CmpHelperEQ<units::measurement,units::measurement>
            ((internal *)local_110,"nm2","nm2b",&local_c0,&local_e0);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_108 == (unit)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x112,pcVar1);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  if (local_108 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_110 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  }
  testing::internal::CmpHelperEQ<units::measurement,units::measurement>
            ((internal *)local_110,"nm3","nm3b",&local_80,&local_a0);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_108 == (unit)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x113,pcVar1);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  if (local_108 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_110 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  }
  testing::internal::CmpHelperEQ<units::measurement,units::measurement>
            ((internal *)local_110,"nm4","nm4b",&local_90,&local_b0);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_120);
    if (local_108 == (unit)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x114,pcVar1);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if (local_120._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_120._M_head_impl + 8))();
    }
  }
  if (local_108 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_110 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  }
  return;
}

Assistant:

TEST(mathOps, multDivReciprocity)
{
    measurement kg1(0.02, g);
    measurement kgT(3.4, ton);
    measurement nMass(247.5, lb);

    auto nm1 = (kg1 / kgT) * nMass;
    auto nm2 = (nMass / kgT * kg1);
    auto nm3 = kg1 * nMass / kgT;
    auto nm4 = nMass * (kg1 / kgT);

    EXPECT_EQ(nm1, nm2);
    EXPECT_EQ(nm1, nm3);
    EXPECT_EQ(nm2, nm4);

    auto nm1b = multiplies(divides(kg1, kgT), nMass);
    auto nm2b = multiplies(divides(nMass, kgT), kg1);
    auto nm2b2 = multiplies(kg1, divides(nMass, kgT));
    auto nm3b = divides(multiplies(kg1, nMass), kgT);
    auto nm4b = multiplies(nMass, divides(kg1, kgT));

    EXPECT_EQ(nm1b, nm2b);
    EXPECT_EQ(nm2b, nm2b2);
    EXPECT_EQ(nm1b, nm3b);
    EXPECT_EQ(nm2b, nm4b);

    EXPECT_EQ(nm1, nm1b);
    EXPECT_EQ(nm2, nm2b);
    EXPECT_EQ(nm3, nm3b);
    EXPECT_EQ(nm4, nm4b);
}